

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

void helper_stctl(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uint uVar1;
  ulong uVar2;
  target_ulong ptr;
  uintptr_t unaff_retaddr;
  
  if ((a2 & 3) == 0) {
    uVar2 = (ulong)r1;
    cpu_stl_data_ra_s390x(env,a2,(uint32_t)env->cregs[r1],unaff_retaddr);
    if (r1 != r3) {
      ptr = a2 + 4;
      do {
        uVar1 = (int)uVar2 + 1U & 0xf;
        uVar2 = (ulong)uVar1;
        cpu_stl_data_ra_s390x(env,ptr,(uint32_t)env->cregs[uVar2],unaff_retaddr);
        ptr = ptr + 4;
      } while (uVar1 != r3);
    }
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(stctl)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t dest = a2;
    uint32_t i;

    if (dest & 0x3) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        cpu_stl_data_ra(env, dest, env->cregs[i], ra);
        dest += sizeof(uint32_t);

        if (i == r3) {
            break;
        }
    }
}